

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::D_formatter<spdlog::details::scoped_padder>::format
          (D_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  char local_39;
  scoped_padder p;
  
  scoped_padder::scoped_padder(&p,10,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::pad2(tm_time->tm_mon + 1,dest);
  local_39 = '/';
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  fmt_helper::pad2(tm_time->tm_mday,dest);
  local_39 = '/';
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  fmt_helper::pad2(tm_time->tm_year % 100,dest);
  scoped_padder::~scoped_padder(&p);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_mday, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }